

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACEncode.h
# Opt level: O3

void inflating<std::ofstream>
               (FreqTable *freqs,BitInStream *bitin,
               basic_ofstream<char,_std::char_traits<char>_> *out,int minLen)

{
  int iVar1;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int iVar2;
  Inflate inf;
  Inflate local_a0;
  
  iVar1 = minLen;
  Inflate::Inflate(&local_a0,0x10,bitin);
  iVar2 = 0;
  __buf = extraout_RDX;
  while( true ) {
    Inflate::read(&local_a0,(int)freqs,__buf,CONCAT44(in_register_0000000c,iVar1));
    if ((((minLen + -1 <= iVar2) && (local_a0.readingDone == true)) && (bitin->streamDone == true))
       && (bitin->remBits < 1)) break;
    std::ostream::put((char)out);
    iVar2 = iVar2 + 1;
    __buf = extraout_RDX_00;
  }
  std::ostream::put((char)out);
  return;
}

Assistant:

void inflating(FreqTable &freqs, BitInStream &bitin, T &out, int minLen = 0) {
    Inflate inf(16, bitin);
    bool flag = false;
    int len = 0;
    while (true) {
        int sym = inf.read(freqs);
        if (len >= minLen - 1) {
            if (inf.readingDone) {
                if(bitin.streamDone && (bitin.remBits <= 0)){
                    out.put(char(sym));
                    break;
                }
            }
        }
        out.put(char(sym));
        len++;
    }
}